

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

StringRef __thiscall
Catch::anon_unknown_26::extractFilenamePart(anon_unknown_26 *this,StringRef filename)

{
  char cVar1;
  size_type shortened_size;
  ulong uVar2;
  char *pcVar3;
  char *index;
  ulong uVar4;
  bool bVar5;
  StringRef SVar6;
  StringRef filename_local;
  
  pcVar3 = filename.m_start;
  filename_local.m_start = (char *)this;
  filename_local.m_size = (size_type)pcVar3;
  do {
    bVar5 = pcVar3 == (char *)0x0;
    pcVar3 = pcVar3 + -1;
    index = (char *)0xffffffffffffffff;
    if (bVar5) break;
    cVar1 = StringRef::operator[](&filename_local,(size_type)pcVar3);
    index = pcVar3;
  } while (cVar1 != '.');
  uVar2 = 0;
  do {
    pcVar3 = index;
    uVar4 = uVar2;
    index = pcVar3 + -1;
    if ((pcVar3 == (char *)0x0) ||
       (cVar1 = StringRef::operator[](&filename_local,(size_type)index), cVar1 == '/')) break;
    cVar1 = StringRef::operator[](&filename_local,(size_type)index);
    uVar2 = uVar4 + 1;
  } while (cVar1 != '\\');
  uVar2 = filename_local.m_size - (long)pcVar3;
  if (filename_local.m_size < pcVar3 || uVar2 == 0) {
    pcVar3 = "";
    uVar4 = 0;
  }
  else {
    pcVar3 = pcVar3 + (long)filename_local.m_start;
    if (uVar2 < uVar4) {
      uVar4 = uVar2;
    }
  }
  SVar6.m_size = uVar4;
  SVar6.m_start = pcVar3;
  return SVar6;
}

Assistant:

StringRef extractFilenamePart(StringRef filename) {
            size_t lastDot = filename.size();
            while (lastDot > 0 && filename[lastDot - 1] != '.') {
                --lastDot;
            }
            --lastDot;

            size_t nameStart = lastDot;
            while (nameStart > 0 && filename[nameStart - 1] != '/' && filename[nameStart - 1] != '\\') {
                --nameStart;
            }

            return filename.substr(nameStart, lastDot - nameStart);
        }